

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> __thiscall
Parser::parseConcatExpr(Parser *this)

{
  Parser *in_RSI;
  unique_ptr<AST::BinaryExpr,_std::default_delete<AST::BinaryExpr>_> local_40;
  undefined1 local_38 [8];
  unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> right;
  undefined4 local_20;
  undefined1 local_19;
  TokenType op;
  Parser *this_local;
  unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *expr;
  
  local_19 = '\0';
  this_local = this;
  parseAddExpr(this);
  while ((in_RSI->m_currToken).type == Ampersand) {
    local_20 = (in_RSI->m_currToken).type;
    eatToken(in_RSI,(in_RSI->m_currToken).type);
    parseAddExpr((Parser *)local_38);
    std::
    make_unique<AST::BinaryExpr,TokenType&,std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>,std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>>
              ((TokenType *)&local_40,
               (unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)&stack0xffffffffffffffe0,
               (unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)this);
    std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>::operator=
              ((unique_ptr<AST::Expr,std::default_delete<AST::Expr>> *)this,&local_40);
    std::unique_ptr<AST::BinaryExpr,_std::default_delete<AST::BinaryExpr>_>::~unique_ptr(&local_40);
    std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>::~unique_ptr
              ((unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)local_38);
  }
  return (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)
         (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<AST::Expr> Parser::parseConcatExpr() {
    std::unique_ptr<AST::Expr> expr = parseAddExpr();
    while (m_currToken.type == TokenType::Ampersand) {
        TokenType op = m_currToken.type;
        eatToken(m_currToken.type);
        auto right = parseAddExpr();
        expr = std::make_unique<AST::BinaryExpr>(op,
                                                 std::move(expr),
                                                 std::move(right));
    }
    return expr;
}